

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_imply_m3(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2)

{
  REF_STATUS RVar1;
  long lVar2;
  double dVar3;
  REF_DBL ab [12];
  double local_78 [4];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  REF_DBL local_30 [4];
  
  m[4] = 0.0;
  m[5] = 0.0;
  m[2] = 0.0;
  m[3] = 0.0;
  *m = 0.0;
  m[1] = 0.0;
  dVar3 = *xyz0 - *xyz1;
  local_78[0] = dVar3 * dVar3;
  local_48 = xyz0[1] - xyz1[1];
  local_78[3] = (dVar3 + dVar3) * local_48;
  local_48 = local_48 * local_48;
  dVar3 = *xyz1 - *xyz2;
  local_78[1] = dVar3 * dVar3;
  local_40 = xyz1[1] - xyz2[1];
  local_58 = (dVar3 + dVar3) * local_40;
  local_40 = local_40 * local_40;
  dVar3 = *xyz2 - *xyz0;
  local_78[2] = dVar3 * dVar3;
  local_38 = xyz2[1] - xyz0[1];
  local_50 = (dVar3 + dVar3) * local_38;
  local_38 = local_38 * local_38;
  lVar2 = 9;
  do {
    local_78[lVar2] = 1.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  RVar1 = ref_matrix_solve_ab(3,4,local_78);
  if (RVar1 == 0) {
    *m = local_30[0];
    m[1] = local_30[1];
    RVar1 = 0;
    m[2] = 0.0;
    m[3] = local_30[2];
    m[4] = 0.0;
    m[5] = 1.0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m3(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                       REF_DBL *xyz2) {
  REF_DBL ab[12];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab3(0, xyz0, xyz1);
  fill_ab3(1, xyz1, xyz2);
  fill_ab3(2, xyz2, xyz0);

  for (i = 0; i < 3; i++) ab[i + 3 * 3] = 1.0;

  RAISE(ref_matrix_solve_ab(3, 4, ab));

  m[0] = ab[0 + 3 * 3];
  m[1] = ab[1 + 3 * 3];
  m[2] = 0.0;
  m[3] = ab[2 + 3 * 3];
  m[4] = 0.0;
  m[5] = 1.0;

  return REF_SUCCESS;
}